

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::KMaxPooling::backward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long col;
  Index IVar6;
  Dim *this_00;
  ostream *poVar7;
  void *this_01;
  CoeffReturnType pfVar8;
  Scalar *pSVar9;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  *in_RDI;
  uint k;
  int oj;
  uint j;
  uint mi;
  uint i_1;
  int *maxmap;
  uint cols;
  uint rows;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_00000138;
  ostream *in_stack_00000140;
  float in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  Dim *in_stack_fffffffffffffee0;
  undefined3 uVar10;
  undefined4 in_stack_fffffffffffffef8;
  uint uVar11;
  Tensor *in_stack_ffffffffffffff08;
  uint local_b4;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  uVar3 = Dim::rows((Dim *)(in_RDI + 0x20));
  uVar4 = Dim::cols((Dim *)(in_RDI + 0x20));
  lVar2 = *(long *)(in_RDI + 0x48);
  local_44 = 0;
  do {
    if (uVar3 <= local_44) {
      return;
    }
    local_48 = 0;
    for (local_4c = 0; local_4c < uVar4; local_4c = local_4c + 1) {
      uVar11 = local_48;
      uVar5 = Dim::size(in_stack_fffffffffffffee0);
      if (uVar5 <= uVar11) {
        __assert_fail("mi < dim.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                      ,0x14d,
                      "virtual void cnn::KMaxPooling::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                     );
      }
      iVar1 = *(int *)(lVar2 + (ulong)local_48 * 4);
      col = (long)iVar1;
      Tensor::operator*(in_stack_ffffffffffffff08);
      IVar6 = Eigen::
              MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      *)0x4b158f);
      uVar10 = (undefined3)in_stack_fffffffffffffef8;
      in_stack_fffffffffffffef8 = CONCAT13(1,uVar10);
      if (col <= IVar6) {
        in_stack_fffffffffffffef8 = CONCAT13(iVar1 < 0,uVar10);
      }
      if ((char)((uint)in_stack_fffffffffffffef8 >> 0x18) != '\0') {
        this_00 = (Dim *)cnn::operator<<((ostream *)in_stack_fffffffffffffee0,
                                         (Dim *)CONCAT44(in_stack_fffffffffffffedc,
                                                         in_stack_fffffffffffffed8));
        Tensor::operator*(in_stack_ffffffffffffff08);
        poVar7 = Eigen::operator<<(in_stack_00000140,in_stack_00000138);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Tensor::operator*(in_stack_ffffffffffffff08);
        poVar7 = Eigen::operator<<(in_stack_00000140,in_stack_00000138);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cerr,"MM:");
        local_b4 = 0;
        while( true ) {
          uVar3 = local_b4;
          uVar4 = Dim::size(this_00);
          if (uVar4 <= uVar3) break;
          poVar7 = std::operator<<((ostream *)&std::cerr,' ');
          std::ostream::operator<<(poVar7,*(int *)(lVar2 + (ulong)local_b4 * 4));
          local_b4 = local_b4 + 1;
        }
        std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<((ostream *)&std::cerr,"BAD: ");
        this_01 = (void *)std::ostream::operator<<(poVar7,iVar1);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        abort();
      }
      Tensor::operator*(in_stack_ffffffffffffff08);
      pfVar8 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ::operator()(in_RDI,CONCAT44(uVar11,in_stack_fffffffffffffef8),col);
      in_stack_fffffffffffffed8 = *pfVar8;
      Tensor::operator*(in_stack_ffffffffffffff08);
      pSVar9 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)in_RDI,CONCAT44(uVar11,in_stack_fffffffffffffef8),col);
      *pSVar9 = in_stack_fffffffffffffed8 + *pSVar9;
      local_48 = local_48 + 1;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void KMaxPooling::backward_impl(const vector<const Tensor*>& xs,
                           const Tensor& fx,
                           const Tensor& dEdf,
                           unsigned i,
                           Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::backward not implemented for CUDA");
#else
  const unsigned rows = dim.rows();
  const unsigned cols = dim.cols();
  const int* maxmap = static_cast<const int*>(aux_mem);
  for (unsigned i = 0; i < rows; ++i) {
    unsigned mi = 0;
    for (unsigned j = 0; j < cols; ++j) {
      assert(mi < dim.size());
      const int oj = maxmap[mi++];
      if (oj > (*dEdxi).cols() || oj < 0) {
        cerr << dim << (*fx) << endl << (*dEdxi) << endl;
        cerr << "MM:"; for (unsigned k=0;k < dim.size(); ++k) cerr << ' ' << maxmap[k];
        cerr << endl;
        cerr << "BAD: " << oj << endl; abort();
      }
      (*dEdxi)(i, oj) += (*dEdf)(i, j);
    }
  }
#endif
}